

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

void __thiscall sector_t::SetSpecial(sector_t *this,secspecial_t *spec)

{
  secspecial_t *spec_local;
  sector_t *this_local;
  
  this->special = spec->special;
  this->damageamount = spec->damageamount;
  FNameNoInit::operator=(&this->damagetype,&spec->damagetype);
  this->damageinterval = spec->damageinterval;
  this->leakydamage = spec->leakydamage;
  this->Flags = this->Flags & 0xfffff84f | spec->Flags & 0x7b0U;
  return;
}

Assistant:

void sector_t::SetSpecial(const secspecial_t *spec)
{
	special = spec->special;
	damageamount = spec->damageamount;
	damagetype = spec->damagetype;
	damageinterval = spec->damageinterval;
	leakydamage = spec->leakydamage;
	Flags = (Flags & ~SECF_SPECIALFLAGS) | (spec->Flags & SECF_SPECIALFLAGS);
}